

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

bool gl4cts::EnhancedLayouts::Utils::checkSSB
               (Program *program,Variable *variable,stringstream *stream)

{
  Interface *this;
  bool bVar1;
  string *parent_name;
  bool bVar2;
  TestError *this_00;
  size_type sVar3;
  reference pvVar4;
  ostream *poVar5;
  void *this_01;
  Descriptor *desc;
  exception *exc;
  string *local_b8;
  string *member_name;
  string *local_90;
  string *name;
  GLint offset;
  string name_str;
  ulong uStack_58;
  GLuint index;
  size_t i;
  size_t size;
  Interface *interface;
  bool result;
  stringstream *stream_local;
  Variable *variable_local;
  Program *program_local;
  
  bVar1 = true;
  bVar2 = Variable::IsBlock(variable);
  if (bVar2) {
    this = (variable->m_descriptor).field_9.m_interface;
    sVar3 = std::
            vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
            ::size(&this->m_members);
    for (uStack_58 = 0; uStack_58 < sVar3; uStack_58 = uStack_58 + 1) {
      name_str.field_2._12_4_ = 0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&offset,"",(allocator<char> *)((long)&name + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&name + 7));
      name._0_4_ = 0;
      pvVar4 = std::
               vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ::operator[](&this->m_members,uStack_58);
      Variable::GetReference((string *)&member_name,&this->m_name,pvVar4,BASIC,0);
      local_90 = (string *)&member_name;
      pvVar4 = std::
               vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ::operator[](&this->m_members,uStack_58);
      parent_name = local_90;
      if (pvVar4->m_type == INTERFACE) {
        pvVar4 = std::
                 vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                 ::operator[](&this->m_members,uStack_58);
        pvVar4 = std::
                 vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
                 ::operator[](&((pvVar4->field_9).m_interface)->m_members,0);
        Variable::GetReference((string *)&exc,parent_name,pvVar4,BASIC,0);
        local_b8 = (string *)&exc;
        std::__cxx11::string::operator=((string *)&offset,local_b8);
        std::__cxx11::string::~string((string *)&exc);
      }
      else {
        std::__cxx11::string::operator=((string *)&offset,(string *)local_90);
      }
      name_str.field_2._12_4_ = Program::GetResourceIndex(program,(string *)&offset,0x92e5);
      Program::GetResource(program,0x92e5,name_str.field_2._12_4_,0x92fc,1,(GLint *)&name);
      pvVar4 = std::
               vector<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable::Descriptor>_>
               ::operator[](&this->m_members,uStack_58);
      if ((GLuint)name != pvVar4->m_offset) {
        poVar5 = std::operator<<((ostream *)(stream + 0x10),"Uniform: ");
        poVar5 = std::operator<<(poVar5,(string *)&pvVar4->m_name);
        poVar5 = std::operator<<(poVar5," - invalid offset: ");
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,(GLuint)name);
        poVar5 = std::operator<<(poVar5," expected: ");
        this_01 = (void *)std::ostream::operator<<(poVar5,pvVar4->m_offset);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        bVar1 = false;
      }
      std::__cxx11::string::~string((string *)&member_name);
      std::__cxx11::string::~string((string *)&offset);
    }
    return bVar1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Not implemented",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
             ,0x4ca);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

bool checkSSB(Program& program, const Utils::Variable& variable, std::stringstream& stream)
{
	bool result = true;

	if (false == variable.IsBlock())
	{
		TCU_FAIL("Not implemented");
	}
	else
	{
		Utils::Interface* interface = variable.m_descriptor.m_interface;

		size_t size = interface->m_members.size();

		for (size_t i = 0; i < size; ++i)
		{
			GLuint		index	= 0;
			std::string name_str = "";
			GLint		offset   = 0;

			const std::string& name =
				Utils::Variable::GetReference(interface->m_name, interface->m_members[i], Utils::Variable::BASIC, 0);

			if (Utils::Variable::INTERFACE == interface->m_members[i].m_type)
			{
				const std::string& member_name = Utils::Variable::GetReference(
					name, interface->m_members[i].m_interface->m_members[0], Utils::Variable::BASIC, 0);

				name_str = member_name;
			}
			else
			{
				name_str = name;
			}

			try
			{
				index = program.GetResourceIndex(name_str, GL_BUFFER_VARIABLE);

				program.GetResource(GL_BUFFER_VARIABLE, index, GL_OFFSET, 1, &offset);
			}
			catch (std::exception& exc)
			{
				stream << "Failed to query program for buffer variable: " << variable.m_descriptor.m_name
					   << ". Reason: " << exc.what() << "\n";

				return false;
			}

			Utils::Variable::Descriptor& desc = interface->m_members[i];

			if (offset != (GLint)desc.m_offset)
			{
				stream << "Uniform: " << desc.m_name << " - invalid offset: " << offset
					   << " expected: " << desc.m_offset << std::endl;
				result = false;
			}
		}
	}

	return result;
}